

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O0

void del_light_source(level *lev,int type,void *id)

{
  void *local_50;
  void *local_38;
  long tmp_id;
  light_source *prev;
  light_source *curr;
  void *id_local;
  int type_local;
  level *lev_local;
  
  if (type == 0) {
    local_38 = (void *)(ulong)*(uint *)((long)id + 0x18);
  }
  else if (type == 1) {
    local_38 = (void *)(ulong)*(uint *)((long)id + 0x28);
  }
  else {
    local_38 = (void *)0x0;
  }
  tmp_id = 0;
  prev = lev->lev_lights;
  do {
    if (prev == (light_source *)0x0) {
      return;
    }
    if (prev->type == type) {
      local_50 = id;
      if ((prev->flags & 2U) != 0) {
        local_50 = local_38;
      }
      if (prev->id == local_50) {
        if (tmp_id == 0) {
          lev->lev_lights = prev->next;
        }
        else {
          *(ls_t **)tmp_id = prev->next;
        }
        free(prev);
        vision_full_recalc = '\x01';
        return;
      }
    }
    tmp_id = (long)prev;
    prev = prev->next;
  } while( true );
}

Assistant:

void del_light_source(struct level *lev, int type, void *id)
{
    light_source *curr, *prev;
    long tmp_id;

    /* need to be prepared for dealing a with light source which
       has only been partially restored during a level change
       (in particular: chameleon vs prot. from shape changers) */
    switch (type) {
    case LS_OBJECT:	tmp_id = (((struct obj *)id)->o_id);
			break;
    case LS_MONSTER:	tmp_id = (((struct monst *)id)->m_id);
			break;
    default:		tmp_id = 0;
			break;
    }

    for (prev = 0, curr = lev->lev_lights; curr; prev = curr, curr = curr->next) {
	if (curr->type != type) continue;
	if (curr->id == ((curr->flags & LSF_NEEDS_FIXUP) ? (void*)tmp_id : id)) {
	    if (prev)
		prev->next = curr->next;
	    else
		lev->lev_lights = curr->next;

	    free(curr);
	    vision_full_recalc = 1;
	    return;
	}
    }
}